

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::cmExtraSublimeTextGenerator(cmExtraSublimeTextGenerator *this)

{
  cmExtraSublimeTextGenerator *this_local;
  
  memset(this,0,0x48);
  cmExternalMakefileProjectGenerator::cmExternalMakefileProjectGenerator
            (&this->super_cmExternalMakefileProjectGenerator);
  (this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExtraSublimeTextGenerator_00cc16a8;
  std::__cxx11::string::string((string *)&this->EnvSettings);
  this->ExcludeBuildFolder = false;
  return;
}

Assistant:

cmExtraSublimeTextGenerator::cmExtraSublimeTextGenerator()
  : cmExternalMakefileProjectGenerator()
{
  this->ExcludeBuildFolder = false;
}